

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_CodeBlock_Type::make(Fl_CodeBlock_Type *this)

{
  int iVar1;
  bool bVar2;
  Fl_CodeBlock_Type *o;
  Fl_Type *p;
  Fl_CodeBlock_Type *this_local;
  
  o = (Fl_CodeBlock_Type *)Fl_Type::current;
  while( true ) {
    bVar2 = false;
    if (o != (Fl_CodeBlock_Type *)0x0) {
      iVar1 = (*(o->super_Fl_Type)._vptr_Fl_Type[0x23])();
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    o = (Fl_CodeBlock_Type *)(o->super_Fl_Type).parent;
  }
  if (o == (Fl_CodeBlock_Type *)0x0) {
    fl_message("Please select a function");
    this_local = (Fl_CodeBlock_Type *)0x0;
  }
  else {
    this_local = (Fl_CodeBlock_Type *)operator_new(0x80);
    Fl_CodeBlock_Type(this_local);
    Fl_Type::name((Fl_Type *)this_local,"if (test())");
    this_local->after = (char *)0x0;
    Fl_Type::add((Fl_Type *)this_local,&o->super_Fl_Type);
    (this_local->super_Fl_Type).factory = &this->super_Fl_Type;
  }
  return &this_local->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_CodeBlock_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_code_block()) p = p->parent;
  if (!p) {
    fl_message("Please select a function");
    return 0;
  }
  Fl_CodeBlock_Type *o = new Fl_CodeBlock_Type();
  o->name("if (test())");
  o->after = 0;
  o->add(p);
  o->factory = this;
  return o;
}